

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

CWalletTx * __thiscall
wallet::wallet_tests::ListCoinsTestingSetup::AddTx(ListCoinsTestingSetup *this,CRecipient recipient)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  int iVar1;
  CWallet *pCVar2;
  uint256 *puVar3;
  mapValue_t mapValue;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  orderForm;
  T *pTVar4;
  iterator iVar5;
  Chainstate *pCVar6;
  _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_RSI;
  CCoinControl *coin_control;
  char *pcVar7;
  iterator pvVar8;
  long in_FS_OFFSET;
  initializer_list<wallet::CRecipient> __l;
  const_string file;
  CTransactionRef tx_00;
  initializer_list<CMutableTransaction> __l_00;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  CTransactionRef tx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock50;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  Result<wallet::CreatedTransactionResult> res;
  CCoinControl dummy;
  undefined4 uVar9;
  undefined4 uVar10;
  check_type cVar11;
  undefined8 in_stack_fffffffffffffb18;
  undefined8 in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  undefined8 in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  pointer in_stack_fffffffffffffb48;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4a8;
  undefined1 local_488 [56];
  char *local_450;
  element_type *local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_440 [2];
  undefined1 local_430 [24];
  direct_or_indirect local_418;
  uint local_3fc;
  CMutableTransaction local_3f8;
  CBlock local_3b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  undefined1 local_318 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_300 [2];
  CAmount local_2c8;
  bool local_2c0;
  undefined1 local_2b8 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_2a0 [5];
  __index_type local_218;
  CCoinControl local_208;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_448 = (element_type *)0x0;
  a_Stack_440[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CCoinControl::CCoinControl(&local_208);
  pCVar2 = (this->wallet)._M_t.
           super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
           super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl;
  std::__detail::__variant::
  _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)local_318,in_RSI);
  local_2c0 = (bool)in_RSI[1].
                    super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    ._M_u._M_first._M_storage._M_storage[8];
  local_2c8 = *(CAmount *)
               &in_RSI[1].
                super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                ._M_u;
  __l._M_len = 1;
  __l._M_array = (iterator)local_318;
  std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::vector
            ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)&local_3f8,__l,
             (allocator_type *)&local_418.indirect_contents);
  coin_control = &local_208;
  pvVar8 = (iterator)0x1;
  CreateTransaction((Result<wallet::CreatedTransactionResult> *)local_2b8,pCVar2,
                    (vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)&local_3f8,
                    (optional<unsigned_int>)0x0,coin_control,true);
  std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::~vector
            ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)&local_3f8);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_318);
  local_488._48_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_450 = "";
  local_488._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_488._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x257;
  file.m_begin = local_488 + 0x30;
  msg.m_end = pvVar8;
  msg.m_begin = (iterator)coin_control;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)(local_488 + 0x20),
             msg);
  local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,local_218 == '\x01');
  local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_418.indirect_contents.indirect = "res";
  local_418._8_8_ = (long)"!res" + 4;
  local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
  local_318._0_8_ = &PTR__lazy_ostream_013abc70;
  local_318._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_488._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_488._24_8_ = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar8 = (iterator)0x0;
  local_300[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_418;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3f8,(lazy_ostream *)local_318,1,0,WARN,_cVar11,
             (size_t)(local_488 + 0x10),599);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pTVar4 = util::Result<wallet::CreatedTransactionResult>::value
                     ((Result<wallet::CreatedTransactionResult> *)local_2b8);
  local_448 = (pTVar4->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (a_Stack_440,
             &(pTVar4->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
                      local_2b8);
  pCVar2 = (this->wallet)._M_t.
           super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
           super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl;
  local_488._0_8_ = local_448;
  local_488._8_8_ = a_Stack_440[0]._M_pi;
  if (a_Stack_440[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_440[0]._M_pi)->_M_use_count = (a_Stack_440[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_440[0]._M_pi)->_M_use_count = (a_Stack_440[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_348._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_348._M_impl.super__Rb_tree_header._M_header;
  local_348._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_348._M_impl._0_8_ = 0;
  local_348._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_348._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_348._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mapValue._M_t._M_impl._4_4_ = uVar10;
  mapValue._M_t._M_impl._0_4_ = uVar9;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (undefined8)_cVar11;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffb18;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffb20;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffb28;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffb30;
  orderForm.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb40;
  orderForm.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb38;
  orderForm.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffb48;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_348;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_488;
  local_348._M_impl.super__Rb_tree_header._M_header._M_right =
       local_348._M_impl.super__Rb_tree_header._M_header._M_left;
  CWallet::CommitTransaction(pCVar2,tx_00,mapValue,orderForm);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_4a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_348);
  if ((pointer)local_488._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_);
  }
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_318);
  local_418.indirect_contents.indirect =
       (char *)&((this->wallet)._M_t.
                 super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
                 super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
                 super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet;
  local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&local_418.indirect_contents);
  iVar5 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(((this->wallet)._M_t.
                    super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                    .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->mapWallet)._M_h,
                 &(local_448->hash).m_wrapped);
  if (iVar5.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
      (__node_type *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00824243:
      __stack_chk_fail();
    }
    std::__throw_out_of_range("_Map_base::at");
  }
  else {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)local_2b8,
               *(CTransaction **)
                ((long)iVar5.
                       super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                       _M_cur + 0x1c0));
    local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_318._16_8_;
    local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_318._8_8_;
    local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_318._0_8_;
    local_318._0_8_ = local_2b8._0_8_;
    local_318._8_8_ = local_2b8._8_8_;
    local_318._16_8_ = local_2b8._16_8_;
    local_2b8._0_8_ = (direct_or_indirect *)0x0;
    local_2b8._8_8_ = (pointer)0x0;
    local_2b8._16_8_ = (pointer)0x0;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_3f8.vin);
    local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)local_300[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_300[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_300[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_300[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_start = avStack_2a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_300[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_finish = avStack_2a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_300[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage =
         avStack_2a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    avStack_2a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_2a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_2a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_3f8);
    local_300[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_start = avStack_2a0[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_2a0);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2b8);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&local_418.indirect_contents);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::vector
              (&local_3f8.vin,(vector<CTxIn,_std::allocator<CTxIn>_> *)local_318);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&local_3f8.vout,local_300);
    local_3f8._48_8_ =
         local_300[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_start;
    __l_00._M_len = 1;
    __l_00._M_array = &local_3f8;
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_430,__l_00
               ,(allocator_type *)&stack0xfffffffffffffb28);
    CKey::GetPubKey((CPubKey *)local_2b8,&(this->super_TestChain100Setup).coinbaseKey);
    GetScriptForRawPubKey((CScript *)&local_418.indirect_contents,(CPubKey *)local_2b8);
    TestChain100Setup::CreateAndProcessBlock
              (&local_3b8,&this->super_TestChain100Setup,
               (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_430,
               (CScript *)&local_418.indirect_contents,(Chainstate *)0x0);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_3b8.vtx);
    if (0x1c < local_3fc) {
      free(local_418.indirect_contents.indirect);
      local_418.indirect_contents.indirect = (char *)0x0;
    }
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_430);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_3f8.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_3f8.vin);
    local_418.indirect_contents.indirect =
         (char *)&((this->wallet)._M_t.
                   super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
                   super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet;
    local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock
              ((unique_lock<std::recursive_mutex> *)&local_418.indirect_contents);
    val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chainman;
    pcVar7 = "m_node.chainman";
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (val,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
               ,0x263,"AddTx","m_node.chainman");
    local_430._0_8_ = &cs_main;
    local_430[8] = false;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_430);
    pCVar2 = (this->wallet)._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl;
    iVar1 = pCVar2->m_last_block_processed_height;
    if (-1 < iVar1) {
      pCVar6 = ChainstateManager::ActiveChainstate
                         ((val->_M_t).
                          super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                          .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      puVar3 = (pCVar6->m_chain).vChain.
               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1]->phashBlock;
      if (puVar3 != (uint256 *)0x0) {
        local_2b8._0_8_ = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
        local_2b8._8_8_ = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
        local_2b8._16_8_ = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
        avStack_2a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
        pCVar2->m_last_block_processed_height = iVar1 + 1;
        *(undefined8 *)((long)&(pCVar2->m_last_block_processed).super_base_blob<256U> + 0x10) =
             local_2b8._16_8_;
        *(pointer *)((long)&(pCVar2->m_last_block_processed).super_base_blob<256U> + 0x18) =
             avStack_2a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(undefined8 *)&(pCVar2->m_last_block_processed).super_base_blob<256U>.m_data =
             local_2b8._0_8_;
        *(undefined8 *)((long)&(pCVar2->m_last_block_processed).super_base_blob<256U> + 8) =
             local_2b8._8_8_;
        iVar5 = std::
                _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(((this->wallet)._M_t.
                          super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                          .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->mapWallet)
                        ._M_h,&(local_448->hash).m_wrapped);
        file_00.m_end = (iterator)0x266;
        file_00.m_begin = &stack0xfffffffffffffb48;
        msg_00.m_end = pvVar8;
        msg_00.m_begin = pcVar7;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                   (size_t)&stack0xfffffffffffffb38,msg_00);
        local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               iVar5.
                               super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                               ._M_cur != (__node_type *)0x0);
        local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
        local_2b8._0_8_ = &PTR__lazy_ostream_013abc70;
        local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
        avStack_2a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&stack0xfffffffffffffb28;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_3f8,(lazy_ostream *)local_2b8,1,0,WARN,_cVar11,
                   (size_t)&stack0xfffffffffffffb18,0x266);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        pCVar6 = ChainstateManager::ActiveChainstate
                           ((val->_M_t).
                            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                            .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
        puVar3 = (pCVar6->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]->phashBlock;
        if (puVar3 != (uint256 *)0x0) {
          local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)(puVar3->super_base_blob<256U>).m_data._M_elems;
          local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_finish =
               *(pointer *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
          local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               *(pointer *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
          local_3f8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
          pCVar6 = ChainstateManager::ActiveChainstate
                             ((val->_M_t).
                              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                              .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
          local_2b8._16_8_ =
               local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          avStack_2a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_3f8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_2b8._0_8_ =
               local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_2b8._8_8_ =
               local_3f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
          avStack_2a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(1,(int)((ulong)((long)(pCVar6->m_chain).vChain.
                                                                                                              
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(pCVar6->m_chain).vChain.
                                                                                                            
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                   -1);
          std::
          variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
          ::operator=((variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
                       *)((long)iVar5.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x1d0),(TxStateConfirmed *)local_2b8);
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)local_430);
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&local_418.indirect_contents);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_300);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_318);
          std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          ::~_Rb_tree(&local_208.m_selected._M_t);
          std::
          _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
          ::~_Rb_tree(&local_208.m_external_provider.tr_trees._M_t);
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::~_Rb_tree(&local_208.m_external_provider.keys._M_t);
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          ::~_Rb_tree(&local_208.m_external_provider.origins._M_t);
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          ::~_Rb_tree(&local_208.m_external_provider.pubkeys._M_t);
          std::
          _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
          ::~_Rb_tree(&local_208.m_external_provider.scripts._M_t);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&local_208);
          if (a_Stack_440[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_440[0]._M_pi);
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            return (CWalletTx *)
                   ((long)iVar5.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x28);
          }
          goto LAB_00824243;
        }
      }
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
  }
  __assert_fail("m_last_block_processed_height >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                ,0x3d1,"int wallet::CWallet::GetLastBlockHeight() const");
}

Assistant:

CWalletTx& AddTx(CRecipient recipient)
    {
        CTransactionRef tx;
        CCoinControl dummy;
        {
            auto res = CreateTransaction(*wallet, {recipient}, /*change_pos=*/std::nullopt, dummy);
            BOOST_CHECK(res);
            tx = res->tx;
        }
        wallet->CommitTransaction(tx, {}, {});
        CMutableTransaction blocktx;
        {
            LOCK(wallet->cs_wallet);
            blocktx = CMutableTransaction(*wallet->mapWallet.at(tx->GetHash()).tx);
        }
        CreateAndProcessBlock({CMutableTransaction(blocktx)}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));

        LOCK(wallet->cs_wallet);
        LOCK(Assert(m_node.chainman)->GetMutex());
        wallet->SetLastBlockProcessed(wallet->GetLastBlockHeight() + 1, m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        auto it = wallet->mapWallet.find(tx->GetHash());
        BOOST_CHECK(it != wallet->mapWallet.end());
        it->second.m_state = TxStateConfirmed{m_node.chainman->ActiveChain().Tip()->GetBlockHash(), m_node.chainman->ActiveChain().Height(), /*index=*/1};
        return it->second;
    }